

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  int *piVar1;
  curl_off_t *pcVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  _Bool _Var8;
  CURLcode CVar9;
  CURLcode CVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  imapstate instate;
  size_t __n;
  char *pcVar15;
  Curl_easy *pCVar16;
  char *pcVar17;
  ulong uStackY_90;
  int imapcode;
  undefined8 local_68;
  ulong local_48;
  SASL *local_40;
  size_t nread;
  
  sockfd = conn->sock[0];
  nread = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar9 = imap_perform_upgrade_tls(conn);
    return CVar9;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar9 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar9;
  }
  local_40 = &(conn->proto).imapc.sasl;
  do {
    CVar9 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&imapcode,&nread);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if (imapcode == -1) {
      return CURLE_FTP_WEIRD_SERVER_REPLY;
    }
    if (imapcode == 0) {
      return 0;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      if (imapcode != 0x4f) {
        Curl_failf(conn->data,"Got unexpected imap-server response");
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      CVar10 = imap_perform_capability(conn);
      break;
    case IMAP_CAPABILITY:
      pCVar16 = conn->data;
      if (imapcode != 0x4f) {
        if (imapcode == 0x2a) {
          pcVar17 = (pCVar16->state).buffer + 2;
LAB_00138bd7:
          do {
            uVar13 = (ulong)(byte)*pcVar17;
            if (uVar13 < 0x21) {
              if ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0) {
                pcVar17 = pcVar17 + 1;
                goto LAB_00138bd7;
              }
              if (uVar13 == 0) goto LAB_00138e82;
            }
            sVar14 = 0xfffffffffffffffb;
            while ((0x20 < (byte)uVar13 || ((0x100002601U >> (uVar13 & 0x3f) & 1) == 0))) {
              lVar6 = sVar14 + 6;
              sVar14 = sVar14 + 1;
              uVar13 = (ulong)(byte)pcVar17[lVar6];
            }
            uStackY_90 = sVar14 + 5;
            if (uStackY_90 == 7) {
              iVar11 = bcmp(pcVar17,"SASL-IR",7);
              if (iVar11 != 0) goto LAB_00138c8f;
              (conn->proto).imapc.ir_supported = true;
              uStackY_90 = 7;
            }
            else if (uStackY_90 == 0xd) {
              iVar11 = bcmp(pcVar17,"LOGINDISABLED",0xd);
              if (iVar11 != 0) goto LAB_00138c8f;
              (conn->proto).imapc.login_disabled = true;
              uStackY_90 = 0xd;
            }
            else if (uStackY_90 == 8) {
              if (*(long *)pcVar17 != 0x534c545452415453) goto LAB_00138c8f;
              (conn->proto).imapc.tls_supported = true;
              uStackY_90 = 8;
            }
            else if (5 < uStackY_90) {
LAB_00138c8f:
              iVar11 = bcmp(pcVar17,"AUTH=",5);
              if (iVar11 == 0) {
                pcVar17 = pcVar17 + 5;
                uVar12 = Curl_sasl_decode_mech(pcVar17,sVar14,&local_68);
                uStackY_90 = sVar14;
                if ((uVar12 != 0) && (CONCAT44(local_68._4_4_,(saslprogress)local_68) == sVar14)) {
                  piVar1 = &(conn->proto).ftpc.diralloc;
                  *piVar1 = *piVar1 | uVar12;
                }
              }
            }
            pcVar17 = pcVar17 + uStackY_90;
          } while( true );
        }
LAB_00138e6e:
        CVar10 = imap_perform_authentication(conn);
        break;
      }
      cVar3 = (pCVar16->set).use_ssl;
      if ((cVar3 == CURLUSESSL_NONE) || (conn->ssl[0].use != false)) goto LAB_00138e6e;
      if ((conn->proto).imapc.tls_supported != true) {
        if (cVar3 != CURLUSESSL_TRY) {
          Curl_failf(pCVar16,"STARTTLS not supported.");
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_00138e6e;
      }
      CVar9 = imap_sendf(conn,"STARTTLS");
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      (conn->proto).imapc.state = IMAP_STARTTLS;
      goto LAB_00138e8f;
    case IMAP_STARTTLS:
      if (imapcode != 0x4f) {
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)(uint)imapcode);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_00138e6e;
      }
      CVar10 = imap_perform_upgrade_tls(conn);
      break;
    default:
      goto switchD_00138a87_caseD_4;
    case IMAP_AUTHENTICATE:
      pCVar16 = conn->data;
      CVar10 = Curl_sasl_continue(local_40,conn,imapcode,(saslprogress *)&local_68);
      if (CVar10 == CURLE_OK) {
        if ((saslprogress)local_68 == SASL_IDLE) {
          if (((conn->proto).imapc.login_disabled != false) ||
             ((*(byte *)((long)&conn->proto + 0x98) & 1) == 0)) {
            pcVar17 = "Authentication cancelled";
            goto LAB_00138e48;
          }
          CVar10 = imap_perform_login(conn);
        }
        else {
          CVar10 = CURLE_OK;
          CVar9 = CURLE_OK;
          if ((saslprogress)local_68 == SASL_DONE) goto LAB_00138e23;
        }
      }
      break;
    case IMAP_LOGIN:
      if (imapcode != 0x4f) {
        Curl_failf(conn->data,"Access denied. %c",(ulong)(uint)imapcode);
        return CURLE_LOGIN_DENIED;
      }
      goto switchD_00138a87_caseD_4;
    case IMAP_LIST:
    case IMAP_SEARCH:
      CVar10 = imap_state_listsearch_resp(conn,imapcode,instate);
      break;
    case IMAP_SELECT:
      pCVar16 = conn->data;
      if (imapcode == 0x4f) {
        pvVar4 = (pCVar16->req).protop;
        if (((*(char **)((long)pvVar4 + 0x10) == (char *)0x0) ||
            (pcVar17 = (conn->proto).imapc.mailbox_uidvalidity, pcVar17 == (char *)0x0)) ||
           (iVar11 = strcmp(*(char **)((long)pvVar4 + 0x10),pcVar17), iVar11 == 0)) {
          pcVar17 = (*Curl_cstrdup)(*(char **)((long)pvVar4 + 8));
          (conn->proto).imapc.mailbox = pcVar17;
          if (*(long *)((long)pvVar4 + 0x38) == 0) {
            if (*(long *)((long)pvVar4 + 0x30) == 0) {
              CVar10 = imap_perform_fetch(conn);
            }
            else {
              CVar10 = imap_perform_search(conn);
            }
          }
          else {
            CVar10 = imap_perform_list(conn);
          }
        }
        else {
          Curl_failf(pCVar16,"Mailbox UIDVALIDITY has changed");
          CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
        }
      }
      else if (imapcode == 0x2a) {
        CVar10 = CURLE_OK;
        iVar11 = __isoc99_sscanf((pCVar16->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                 &local_68);
        if (iVar11 == 1) {
          (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
          (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
          pcVar17 = (*Curl_cstrdup)((char *)&local_68);
          (conn->proto).imapc.mailbox_uidvalidity = pcVar17;
        }
      }
      else {
        pcVar17 = "Select failed";
LAB_00138e48:
        Curl_failf(pCVar16,pcVar17);
        CVar10 = CURLE_LOGIN_DENIED;
      }
      break;
    case IMAP_FETCH:
      pCVar16 = conn->data;
      if (imapcode == 0x2a) {
        pcVar17 = (pCVar16->state).buffer;
        pcVar15 = (pCVar16->state).buffer;
        while( true ) {
          pcVar15 = pcVar15 + 1;
          if (pcVar15[-1] == '\0') break;
          if (pcVar15[-1] == '{') {
            uVar13 = strtol(pcVar15,(char **)&local_68,10);
            pcVar15 = (char *)CONCAT44(local_68._4_4_,(saslprogress)local_68);
            if ((((1 < (long)pcVar15 - (long)pcVar17) && (*pcVar15 == '}')) && (pcVar15[1] == '\r'))
               && (pcVar15[2] == '\0')) {
              Curl_infof(pCVar16,"Found %llu bytes to download\n",uVar13);
              Curl_pgrsSetDownloadSize(pCVar16,uVar13);
              pcVar17 = (pp->ftpc).pp.cache;
              if (pcVar17 != (char *)0x0) {
                local_48 = (conn->proto).ftpc.pp.cache_size;
                if (uVar13 <= local_48) {
                  local_48 = uVar13;
                }
                CVar9 = Curl_client_write(conn,1,pcVar17,local_48);
                uVar7 = local_48;
                if (CVar9 != CURLE_OK) {
                  return CVar9;
                }
                pcVar2 = &(pCVar16->req).bytecount;
                *pcVar2 = *pcVar2 + local_48;
                Curl_infof(pCVar16,"Written %llu bytes, %llu bytes are left for transfer\n",local_48
                          );
                uVar5 = (conn->proto).ftpc.pp.cache_size;
                __n = uVar5 - uVar7;
                if (uVar5 < uVar7 || __n == 0) {
                  (*Curl_cfree)((pp->ftpc).pp.cache);
                  (pp->ftpc).pp.cache = (char *)0x0;
                  sVar14 = 0;
                }
                else {
                  memmove((conn->proto).generic,(void *)((long)(conn->proto).generic + uVar7),__n);
                  sVar14 = (conn->proto).ftpc.pp.cache_size - uVar7;
                }
                (conn->proto).ftpc.pp.cache_size = sVar14;
              }
              if ((pCVar16->req).bytecount == uVar13) {
                iVar11 = -1;
                uVar13 = 0xffffffffffffffff;
              }
              else {
                (pCVar16->req).maxdownload = uVar13;
                iVar11 = 0;
              }
              Curl_setup_transfer(conn,iVar11,uVar13,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
              CVar9 = CURLE_OK;
              goto LAB_00138e23;
            }
            break;
          }
          pcVar17 = pcVar17 + 1;
        }
        Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
        CVar9 = CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      else {
        Curl_pgrsSetDownloadSize(pCVar16,-1);
        CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_00138e23:
      CVar10 = CVar9;
      (conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      if (imapcode != 0x4f) {
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      goto switchD_00138a87_caseD_4;
    case IMAP_APPEND:
      if (imapcode != 0x2b) {
        return CURLE_UPLOAD_FAILED;
      }
      Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    case IMAP_APPEND_FINAL:
      if (imapcode != 0x4f) {
        return CURLE_UPLOAD_FAILED;
      }
switchD_00138a87_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    }
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
LAB_00138e82:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_00138e8f:
    _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var8) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_FTP_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}